

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zt_progname.c
# Opt level: O1

char * zt_progpath(char *prog)

{
  int iVar1;
  char *pcVar2;
  size_t sVar3;
  ulong uVar4;
  char *__file;
  int *piVar5;
  ulong i;
  ulong uVar6;
  stat sbuf;
  char cwd [4097];
  
  if ((prog == (char *)0x0) || (*prog == '\0')) goto LAB_00106f95;
  memset(_progpath,0,0x1000);
  zt_cstr_dirname(_progpath,0x1000,prog);
  if ((_progpath[0] == '\0') || (_progpath._0_2_ == 0x2e)) {
    pcVar2 = getenv("PATH");
    if (pcVar2 != (char *)0x0) {
      sVar3 = strlen(pcVar2);
      uVar6 = 0;
      i = 0;
      do {
        if (sVar3 <= i) goto LAB_00106f15;
        uVar4 = zt_cstr_any(pcVar2,i,-1,":");
        if ((long)uVar4 < 0) {
          iVar1 = 5;
          uVar4 = i;
        }
        else {
          __file = zt_cstr_catv(pcVar2,uVar6,uVar4 - 1,"/",0,0xffffffff,prog,0,0xffffffffffffffff,0)
          ;
          piVar5 = __errno_location();
          *piVar5 = 0;
          iVar1 = stat(__file,(stat *)&sbuf);
          if (iVar1 == 0) {
            zt_cstr_dirname(_progpath,0x1000,__file);
            iVar1 = 1;
            if (__file != (char *)0x0) {
              free(__file);
            }
          }
          else {
            if (__file != (char *)0x0) {
              free(__file);
            }
            uVar6 = uVar4 + 1;
            iVar1 = 0;
            uVar4 = uVar6;
          }
        }
        i = uVar4;
      } while (iVar1 == 0);
      if (iVar1 == 5) {
LAB_00106f15:
        if ((_progpath._0_2_ == 0x2e) && (pcVar2 = getcwd(cwd,0x1000), pcVar2 != (char *)0x0)) {
          zt_cstr_copy(cwd,0,-1,_progpath,0x1000);
        }
      }
      goto LAB_00106f95;
    }
    pcVar2 = zt_os_progpath();
    if (pcVar2 == (char *)0x0) goto LAB_00106f95;
    zt_cstr_dirname(_progpath,0x1000,pcVar2);
  }
  else {
    pcVar2 = getcwd(cwd,0x1000);
    if (_progpath[0] == '/' || pcVar2 == (char *)0x0) goto LAB_00106f95;
    pcVar2 = _progpath + 2;
    if (_progpath[1] != '/' || _progpath[0] != '.') {
      pcVar2 = _progpath;
    }
    pcVar2 = zt_cstr_path_append(cwd,pcVar2);
    zt_cstr_copy(pcVar2,0,-1,_progpath,0x1000);
    if (pcVar2 == (char *)0x0) goto LAB_00106f95;
  }
  free(pcVar2);
LAB_00106f95:
  return _progpath;
}

Assistant:

char *
zt_progpath(char *prog) {

    /* If prog is !NULL then try to calculate the correct path.
     * Otherwise just return the current path setting.
     */
    if(prog && *prog != '\0') {
        /* if the passed in path is not NULL */
        memset(_progpath, '\0', PATH_MAX);
        zt_cstr_dirname(_progpath, PATH_MAX, prog);

        if(_progpath[0] == '\0' || strcmp(_progpath, ".") == 0) {
            /* the passed in prog did not include a path */
            char        * path;
            size_t        offt = 0;
            ssize_t       base = 0;
            size_t        len;
            char        * tpath;
            struct stat   sbuf;

            path = getenv("PATH");

            if (!path) {
                /* try to use system specific methods to get the path */
                char    * pp;

                if ((pp = zt_os_progpath()) == NULL) {
                    return _progpath;
                }

                zt_cstr_dirname(_progpath, PATH_MAX, pp);
                zt_free(pp);
                return _progpath;
            }

            len = strlen(path);
            while(offt < len) {
                ssize_t   sofft;

                if ((sofft = zt_cstr_any(path, offt, -1, ENV_SEPERATOR)) < 0) {
                    break;
                }
                offt = (size_t)sofft;
                tpath = zt_cstr_catv(path, base, offt-1,
                                     PATH_SEPERATOR, 0, -1,
                                     prog, 0, -1, NULL);

                errno = 0;
                if((stat(tpath, &sbuf) == 0)) {
                    zt_cstr_dirname(_progpath, PATH_MAX, tpath);
                    zt_free(tpath);
                    return _progpath;
                }
                zt_free(tpath);
                base = offt+1;
                offt++;
            }

            /* if still no path */
            if (strcmp(_progpath, ".") == 0) {
                /* just return the cwd */
                char      cwd[PATH_MAX+1];
                if (getcwd(cwd, PATH_MAX) != NULL) {
                    zt_cstr_copy(cwd, 0, -1, _progpath, PATH_MAX);
                }
            }
        } else {
            /* the passed in path did include a path
             * determine if it is relative
             */
            char      cwd[PATH_MAX+1];

            if(getcwd(cwd, PATH_MAX) != NULL) {
                if (_progpath[0] != '/') {
                    /* path is relative append and remove prog */
                    char      * tpath;
                    char      * pp = _progpath;

                    if(_progpath[0] == '.' &&  _progpath[1] == '/') {
                        /* if it starts with ./ then remove it */
                        pp += 2;
                    }

                    tpath = zt_cstr_path_append(cwd, pp);
                    zt_cstr_copy(tpath, 0, -1, _progpath, PATH_MAX);
                    zt_free(tpath);
                }
            }
        }
    }
    return _progpath;
}